

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb_test_helper.c
# Opt level: O0

MMDB_lookup_result_s *
lookup_string_ok(MMDB_lookup_result_s *__return_storage_ptr__,MMDB_s *mmdb,char *ip,char *file,
                char *mode_desc)

{
  int local_30;
  int local_2c;
  int mmdb_error;
  int gai_error;
  char *mode_desc_local;
  char *file_local;
  char *ip_local;
  MMDB_s *mmdb_local;
  
  _mmdb_error = mode_desc;
  mode_desc_local = file;
  file_local = ip;
  ip_local = (char *)mmdb;
  MMDB_lookup_string(__return_storage_ptr__,mmdb,ip,&local_2c,&local_30);
  test_lookup_errors(local_2c,local_30,"MMDB_lookup_string",file_local,mode_desc_local,_mmdb_error);
  return __return_storage_ptr__;
}

Assistant:

MMDB_lookup_result_s lookup_string_ok(MMDB_s *mmdb,
                                      const char *ip,
                                      const char *file,
                                      const char *mode_desc) {
    int gai_error, mmdb_error;
    MMDB_lookup_result_s result =
        MMDB_lookup_string(mmdb, ip, &gai_error, &mmdb_error);

    test_lookup_errors(
        gai_error, mmdb_error, "MMDB_lookup_string", ip, file, mode_desc);

    return result;
}